

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O2

BIO * BIO_new_mem_buf(void *buf,int len)

{
  byte *pbVar1;
  size_t *psVar2;
  size_t sVar3;
  BIO *pBVar4;
  int in_register_00000034;
  
  sVar3 = CONCAT44(in_register_00000034,len);
  if (in_register_00000034 < 0) {
    sVar3 = strlen((char *)buf);
  }
  if (CONCAT44(in_register_00000034,len) == 0 || buf != (void *)0x0) {
    pBVar4 = BIO_new((BIO_METHOD *)&mem_method);
    if (pBVar4 == (BIO *)0x0) {
      pBVar4 = (BIO *)0x0;
    }
    else {
      psVar2 = *(size_t **)&pBVar4->num;
      psVar2[1] = (size_t)buf;
      *psVar2 = sVar3;
      psVar2[2] = sVar3;
      pbVar1 = (byte *)((long)&pBVar4->init + 1);
      *pbVar1 = *pbVar1 | 2;
      pBVar4->flags = 0;
    }
  }
  else {
    pBVar4 = (BIO *)0x0;
    ERR_put_error(0x11,0,0x6f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_mem.cc"
                  ,0x21);
  }
  return pBVar4;
}

Assistant:

BIO *BIO_new_mem_buf(const void *buf, ossl_ssize_t len) {
  BIO *ret;
  BUF_MEM *b;
  const size_t size = len < 0 ? strlen((char *)buf) : (size_t)len;

  if (!buf && len != 0) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_NULL_PARAMETER);
    return NULL;
  }

  ret = BIO_new(BIO_s_mem());
  if (ret == NULL) {
    return NULL;
  }

  b = (BUF_MEM *)ret->ptr;
  // BIO_FLAGS_MEM_RDONLY ensures |b->data| is not written to.
  b->data = reinterpret_cast<char *>(const_cast<void *>(buf));
  b->length = size;
  b->max = size;

  ret->flags |= BIO_FLAGS_MEM_RDONLY;

  // |num| is used to store the value that this BIO will return when it runs
  // out of data. If it's negative then the retry flags will also be set. Since
  // this is static data, retrying wont help
  ret->num = 0;

  return ret;
}